

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_1d5768::CAPITask::start(CAPITask *this,TaskInterface ti)

{
  llb_task_interface_t lVar1;
  BuildEngineDelegate *pBVar2;
  CAPIBuildEngineDelegate *delegate;
  CAPITask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (CAPITask *)ti.impl;
  pBVar2 = llbuild::core::TaskInterface::delegate((TaskInterface *)&this_local);
  lVar1.ctx = ti_local.impl;
  lVar1.impl = this_local;
  (*(this->cAPIDelegate).start)
            ((this->cAPIDelegate).context,pBVar2[2]._vptr_BuildEngineDelegate,lVar1);
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    CAPIBuildEngineDelegate* delegate =
      static_cast<CAPIBuildEngineDelegate*>(ti.delegate());
    cAPIDelegate.start(cAPIDelegate.context,
                       delegate->cAPIDelegate.context,
                       *reinterpret_cast<llb_task_interface_t*>(&ti));
  }